

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileloader.cpp
# Opt level: O0

void file_loader(char *filename,
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *param,int *car_capacity,int *num_car)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  istream *piVar5;
  ulong uVar6;
  long *plVar7;
  int *in_RCX;
  int *in_RDX;
  char *in_RDI;
  int tmp;
  vector<int,_std::allocator<int>_> tmp_vec;
  stringstream ss_1;
  stringstream ss;
  int i;
  string line;
  ifstream ifs;
  undefined4 in_stack_fffffffffffffa28;
  int local_58c [7];
  stringstream local_570 [392];
  stringstream local_3e8 [396];
  int local_25c;
  string local_258 [48];
  istream local_228 [520];
  int *local_20;
  int *local_18;
  char *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::ifstream::ifstream(local_228,in_RDI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_258);
    for (local_25c = 0; local_25c < 4; local_25c = local_25c + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
    _Var3 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_3e8,local_258,_Var3);
    piVar5 = (istream *)std::istream::operator>>((istream *)local_3e8,local_20);
    std::istream::operator>>(piVar5,local_18);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      uVar6 = std::__cxx11::string::size();
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar6);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      uVar6 = std::__cxx11::string::size();
      if ((0x41 < uVar6) && (uVar6 = std::__cxx11::string::size(), uVar6 < 0x4c)) {
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_570,local_258,_Var3);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x11630e);
        while( true ) {
          plVar7 = (long *)std::istream::operator>>((istream *)local_570,local_58c);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
          if (!bVar2) break;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)poVar4,
                     (value_type *)CONCAT44(_Var3,in_stack_fffffffffffffa28));
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     *)poVar4,(value_type *)CONCAT44(_Var3,in_stack_fffffffffffffa28));
        std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar4)
        ;
        std::__cxx11::stringstream::~stringstream(local_570);
      }
    }
    std::ifstream::close();
    std::__cxx11::stringstream::~stringstream(local_3e8);
    std::__cxx11::string::~string(local_258);
    std::ifstream::~ifstream(local_228);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Error, cannot open file, check argv: ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void file_loader (const char *filename, 
				std::vector<std::vector<int> > &param, 
				int &car_capacity, int &num_car)
{
	//https://qiita.com/Reed_X1319RAY/items/098596cda78e9c1a6bad
	std::ifstream ifs(filename, std::ios::in);
	if(!ifs.is_open()){
		std::cerr << "Error, cannot open file, check argv: " << filename << std::endl;
		std::exit(1); 
	}
   std::string line;
   for(int i = 0; i < 4; i++){
   	std::getline(ifs, line);
   }
   std::getline(ifs, line);
   std::stringstream ss(line);
   ss >> num_car >> car_capacity;
   while (std::getline(ifs, line)){
   	std::cout << line.size() << std::endl;
	   if(66 <= line.size() && line.size() <= 75){
	    	std::stringstream ss(line);
	      std::vector<int> tmp_vec;
	      int tmp;
	      while (ss >> tmp){
	      	tmp_vec.push_back(tmp);
	      }
	      param.push_back(tmp_vec);
	   }
   }
   ifs.close();
}